

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

mem_expr_t add_mem_insn(gen_ctx_t gen_ctx,MIR_insn_t mem_insn)

{
  gvn_ctx *pgVar1;
  VARR_mem_expr_t *pVVar2;
  mem_expr_t el;
  int iVar3;
  mem_expr *in_RAX;
  ulong uVar4;
  undefined4 extraout_var;
  mem_expr_t tab_e;
  mem_expr *local_18;
  
  if (((*(uint *)&mem_insn->field_0x18 & 0xfffffffc) == 0) &&
     ((mem_insn->ops[0].field_0x8 == '\v' || (*(char *)&mem_insn[1].insn_link.prev == '\v')))) {
    pgVar1 = gen_ctx->gvn_ctx;
    pVVar2 = pgVar1->mem_exprs;
    if ((pVVar2 != (VARR_mem_expr_t *)0x0) &&
       ((pVVar2->varr != (mem_expr_t *)0x0 &&
        (uVar4 = (ulong)*(uint *)((long)mem_insn->data + 0x10), uVar4 < pVVar2->els_num)))) {
      el = pVVar2->varr[uVar4];
      el->next = (mem_expr *)0x0;
      local_18 = in_RAX;
      iVar3 = HTAB_mem_expr_t_do(pgVar1->mem_expr_tab,el,HTAB_FIND,&local_18);
      if (iVar3 != 0) {
        el->next = local_18;
      }
      iVar3 = HTAB_mem_expr_t_do(gen_ctx->gvn_ctx->mem_expr_tab,el,HTAB_REPLACE,&local_18);
      return (mem_expr_t)CONCAT44(extraout_var,iVar3);
    }
    add_mem_insn_cold_1();
  }
  __assert_fail("move_code_p (mem_insn->code) && (mem_insn->ops[0].mode == MIR_OP_VAR_MEM || mem_insn->ops[1].mode == MIR_OP_VAR_MEM)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0xe9c,"mem_expr_t add_mem_insn(gen_ctx_t, MIR_insn_t)");
}

Assistant:

static mem_expr_t add_mem_insn (gen_ctx_t gen_ctx, MIR_insn_t mem_insn) {
  bb_insn_t bb_insn = mem_insn->data;
  mem_expr_t tab_e, e;

  gen_assert (
    move_code_p (mem_insn->code)
    && (mem_insn->ops[0].mode == MIR_OP_VAR_MEM || mem_insn->ops[1].mode == MIR_OP_VAR_MEM));
  e = VARR_GET (mem_expr_t, mem_exprs, bb_insn->mem_index);
  e->next = NULL;
  if (HTAB_DO (mem_expr_t, mem_expr_tab, e, HTAB_FIND, tab_e)) e->next = tab_e;
  HTAB_DO (mem_expr_t, mem_expr_tab, e, HTAB_REPLACE, tab_e);
  return e;
}